

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O1

sexp_conflict
sexp_flatan2_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,
                 sexp_conflict arg1)

{
  sexp_conflict psVar1;
  
  psVar1 = arg0;
  if ((((((ulong)arg0 & 3) == 0) && (arg0->tag == 0xb)) && (psVar1 = arg1, ((ulong)arg1 & 3) == 0))
     && (arg1->tag == 0xb)) {
    atan2((arg0->value).flonum,(arg1->value).flonum);
    psVar1 = (sexp_conflict)sexp_make_flonum(ctx);
    return psVar1;
  }
  psVar1 = (sexp_conflict)sexp_type_exception(ctx,self,0xb,psVar1);
  return psVar1;
}

Assistant:

sexp sexp_flatan2_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1) {
  sexp res;
  if (! sexp_flonump(arg0))
    return sexp_type_exception(ctx, self, SEXP_FLONUM, arg0);
  if (! sexp_flonump(arg1))
    return sexp_type_exception(ctx, self, SEXP_FLONUM, arg1);
  res = sexp_make_flonum(ctx, atan2(sexp_flonum_value(arg0), sexp_flonum_value(arg1)));
  return res;
}